

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O1

void leccalc::loadoccurrence
               (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *event_to_periods,int *totalperiods)

{
  int *piVar1;
  long lVar2;
  float fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  FILE *__stream;
  size_t sVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  long *in_RCX;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *extraout_RDX;
  uint uVar10;
  int *piVar11;
  char *pcVar12;
  char *pcVar13;
  uint in_R8D;
  aggreports *in_R9;
  bool bVar14;
  int date_opts;
  occurrence occ;
  int iStack_bc;
  float fStack_b8;
  key_type kStack_b4;
  uint uStack_a8;
  int iStack_a4;
  int aiStack_a0 [2];
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *p_Stack_98;
  char *pcStack_90;
  char *pcStack_88;
  size_t sStack_80;
  char *pcStack_78;
  ulong uStack_70;
  uint local_34;
  occurrence_granular local_30;
  
  pcVar13 = "input/occurrence.bin";
  pcVar12 = "rb";
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream != (FILE *)0x0) {
    local_34 = 0;
    fread(&local_34,4,1,__stream);
    fread(totalperiods,4,1,__stream);
    if (local_34 < 2) {
      loadoccurrence<occurrence>(event_to_periods,(occurrence *)&local_30,(FILE *)__stream);
    }
    else {
      loadoccurrence<occurrence_granular>(event_to_periods,&local_30,(FILE *)__stream);
    }
    fclose(__stream);
    return;
  }
  loadoccurrence();
  p_Stack_98 = extraout_RDX;
  checkinputfile((uint *)pcVar13,(FILE *)_stdin,in_R9);
  pcStack_90 = pcVar12 + 8;
  sVar7 = 1;
  uStack_a8 = in_R8D ^ 1;
  pcStack_88 = pcVar12;
  uVar10 = uStack_a8;
  do {
    if (sVar7 == 0) {
      return;
    }
    sVar8 = fread(&iStack_a4,0xc,1,_stdin);
    sVar7 = sVar8;
    iVar4 = kStack_b4.summary_id;
    sVar5 = sStack_80;
    if (sVar8 == 1) {
      pcVar13 = pcStack_90;
      for (pcVar12 = *(char **)(pcStack_88 + 0x10); pcVar12 != (char *)0x0;
          pcVar12 = *(char **)(pcVar12 + (ulong)(*(int *)(pcVar12 + 0x20) < iStack_a4) * 8 + 0x10))
      {
        if (iStack_a4 <= *(int *)(pcVar12 + 0x20)) {
          pcVar13 = pcVar12;
        }
      }
      pcVar12 = pcStack_90;
      if ((pcVar13 != pcStack_90) && (pcVar12 = pcVar13, iStack_a4 < *(int *)(pcVar13 + 0x20))) {
        pcVar12 = pcStack_90;
      }
      if (pcVar12 == pcStack_90) {
        do {
          sVar7 = fread(&kStack_b4,8,1,_stdin);
          iVar4 = kStack_b4.summary_id;
          sVar5 = sStack_80;
          if (sVar7 != 1) break;
        } while (kStack_b4.summary_id != 0);
      }
      else {
        pcStack_78 = pcVar12;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(p_Stack_98,aiStack_a0);
        sVar7 = fread(&iStack_bc,8,1,_stdin);
        sVar6 = sVar8;
        fVar3 = fStack_b8;
        iVar4 = kStack_b4.summary_id;
        kStack_b4.summary_id = aiStack_a0[0];
        sVar5 = sStack_80;
        while ((sStack_80 = sVar6, fStack_b8 = fVar3, aiStack_a0[0] = kStack_b4.summary_id,
               sVar7 == 1 && (iStack_bc != 0))) {
          if ((1 < iStack_bc + 5U) && ((fVar3 <= 0.0 & (byte)uVar10) == 0)) {
            piVar11 = *(int **)(pcStack_78 + 0x28);
            piVar1 = *(int **)(pcStack_78 + 0x30);
            sVar8 = sStack_80;
            iVar4 = kStack_b4.summary_id;
            uVar10 = uStack_a8;
            if (piVar11 != piVar1) {
              bVar14 = iStack_bc != -1;
              uStack_70 = (ulong)bVar14;
              do {
                kStack_b4.period_no = *piVar11;
                lVar2 = (ulong)bVar14 * 0x30;
                pmVar9 = std::
                         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                         ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                       *)(*in_RCX + lVar2),&kStack_b4);
                pmVar9->agg_out_loss = pmVar9->agg_out_loss + fVar3;
                pmVar9 = std::
                         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                         ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                       *)(lVar2 + *in_RCX),&kStack_b4);
                if (pmVar9->max_out_loss <= fVar3 && fVar3 != pmVar9->max_out_loss) {
                  pmVar9 = std::
                           map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                           ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                         *)((ulong)(uint)((int)uStack_70 * 0x30) + *in_RCX),
                                        &kStack_b4);
                  pmVar9->max_out_loss = fVar3;
                }
                piVar11 = piVar11 + 1;
                sVar8 = sStack_80;
                iVar4 = kStack_b4.summary_id;
                uVar10 = uStack_a8;
              } while (piVar11 != piVar1);
            }
          }
          kStack_b4.summary_id = iVar4;
          sVar7 = fread(&iStack_bc,8,1,_stdin);
          sVar6 = sStack_80;
          fVar3 = fStack_b8;
          iVar4 = kStack_b4.summary_id;
          kStack_b4.summary_id = aiStack_a0[0];
          sVar5 = sStack_80;
        }
      }
    }
    sStack_80 = sVar5;
    kStack_b4.summary_id = iVar4;
    if (sVar8 != 1) {
      return;
    }
  } while( true );
}

Assistant:

void loadoccurrence(std::map<int, std::vector<int> >& event_to_periods,
			    int& totalperiods)
	{
		FILE* fin = fopen(OCCURRENCE_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: Error reading file %s\n",
				OCCURRENCE_FILE);
			exit(-1);
		}

		int date_opts = 0;
		fread(&date_opts, sizeof(date_opts), 1, fin);
		fread(&totalperiods, sizeof(totalperiods), 1, fin);
		int granular_date = date_opts >> 1;
		if (granular_date) {
			occurrence_granular occ;
			loadoccurrence(event_to_periods, occ, fin);
		} else {
			occurrence occ;
			loadoccurrence(event_to_periods, occ, fin);
		}

		fclose(fin);
	}